

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  byte bVar1;
  Compilation *compilation;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ConditionalPredicateSyntax *pCVar5;
  ConditionalPatternSyntax *pCVar6;
  ExpressionSyntax *pEVar7;
  Type *pTVar8;
  Pattern *this;
  Type *pTVar9;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  ulong uVar12;
  Expression *this_00;
  Expression *this_01;
  undefined4 extraout_var_00;
  ConditionalExpression *expr;
  SourceLocation SVar13;
  Diagnostic *diag;
  Diagnostic *diag_00;
  ParentList *pPVar14;
  bitmask<slang::ast::ASTFlags> extraFlags;
  EVP_PKEY_CTX *src;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  byte bVar15;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *pSVar16;
  bool bVar17;
  ulong uVar18;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Type *lt;
  Type *rt;
  iterator __begin2;
  ASTContext trueContext;
  VarMap patternVarMap;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  Type *local_1b0;
  byte local_1a1;
  Type *local_1a0;
  Compilation *local_198;
  ConditionalExpressionSyntax *local_190;
  iterator_base<slang::syntax::ConditionalPatternSyntax_*> local_188;
  ASTContext *local_178;
  undefined8 local_170;
  Type *local_168;
  ulong local_160;
  ASTContext local_158;
  undefined1 local_118 [32];
  char local_f8;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
  local_90;
  SmallVectorBase<slang::ast::ConditionalExpression::Condition> local_68;
  int *piVar10;
  
  local_68.data_ = (pointer)local_68.firstElement;
  local_68.len = 0;
  local_68.cap = 2;
  local_158.assertionInstance = context->assertionInstance;
  local_158.scope.ptr = (context->scope).ptr;
  local_158.lookupIndex = context->lookupIndex;
  local_158._12_4_ = *(undefined4 *)&context->field_0xc;
  local_158.flags.m_bits = (context->flags).m_bits;
  local_158.instanceOrProc = context->instanceOrProc;
  local_158.firstTempVar = context->firstTempVar;
  local_158.randomizeDetails = context->randomizeDetails;
  local_198 = comp;
  local_190 = syntax;
  local_178 = context;
  local_168 = assignmentTarget;
  pCVar5 = not_null<slang::syntax::ConditionalPredicateSyntax_*>::get(&syntax->predicate);
  pSVar16 = &pCVar5->conditions;
  local_188.index = 0;
  local_188.list = pSVar16;
  local_160 = (pCVar5->conditions).elements.size_ + 1 >> 1;
  local_1a1 = 1;
  uVar12 = 0;
  local_170 = 0;
  bVar15 = 1;
  bVar17 = false;
  pPVar14 = pSVar16;
  while ((bVar1 = local_1a1, pPVar14 != pSVar16 || (uVar12 != local_160))) {
    pCVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
             iterator_base<slang::syntax::ConditionalPatternSyntax_*>::operator*(&local_188);
    pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pCVar6->expr);
    pTVar8 = (Type *)Expression::selfDetermined
                               (local_198,pEVar7,&local_158,(bitmask<slang::ast::ASTFlags>)0x0);
    bVar2 = Expression::bad((Expression *)pTVar8);
    if (pCVar6->matchesClause == (MatchesClauseSyntax *)0x0) {
      pTVar9 = not_null<const_slang::ast::Type_*>::get
                         ((not_null<const_slang::ast::Type_*> *)&(pTVar8->super_Symbol).name);
      bVar3 = Type::isFourState(pTVar9);
      local_170 = CONCAT71((int7)((ulong)local_170 >> 8),(byte)local_170 | bVar3);
      if ((bVar17 | bVar2) == 0) {
        bVar17 = ASTContext::requireBooleanConvertible(&local_158,(Expression *)pTVar8);
        bVar17 = !bVar17;
        piVar10 = (int *)0x0;
        goto LAB_0031f68a;
      }
      bVar17 = true;
      piVar10 = (int *)0x0;
    }
    else {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
      ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
                  *)local_118);
      this = (Pattern *)
             not_null<slang::syntax::PatternSyntax_*>::get(&pCVar6->matchesClause->pattern);
      pTVar9 = not_null<const_slang::ast::Type_*>::get
                         ((not_null<const_slang::ast::Type_*> *)&(pTVar8->super_Symbol).name);
      iVar4 = Pattern::bind(this,(int)pTVar9,(sockaddr *)local_118,(socklen_t)&local_158);
      piVar10 = (int *)CONCAT44(extraout_var,iVar4);
      bVar17 = (bool)(bVar17 | bVar2 | *piVar10 == 0);
      ska::detailv3::
      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
      ::~sherwood_v3_table(&local_90);
      bVar15 = 0;
LAB_0031f68a:
      if ((bVar17 == false) && (bVar15 != 0)) {
        ASTContext::tryEval((ConstantValue *)local_118,&local_158,(Expression *)pTVar8);
        if (local_f8 == '\0') {
          bVar15 = 0;
        }
        else if ((local_f8 == '\x01') &&
                (pvVar11 = std::
                           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)local_118),
                (pvVar11->super_SVIntStorage).unknownFlag != false)) {
          bVar15 = 0;
        }
        else {
          bVar2 = ConstantValue::isTrue((ConstantValue *)local_118);
          local_1a1 = local_1a1 & bVar2;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_118);
      }
    }
    local_1b0 = pTVar8;
    not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression*,void>
              ((not_null<slang::ast::Expression_const*> *)local_118,(Expression **)&local_1b0);
    local_118._8_8_ = piVar10;
    SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
    emplace_back<slang::ast::ConditionalExpression::Condition>(&local_68,(Condition *)local_118);
    uVar12 = local_188.index + 1;
    local_188.index = uVar12;
    pPVar14 = local_188.list;
  }
  uVar12 = (ulong)((uint)(bVar15 & local_1a1) * 2);
  uVar18 = (local_178->flags).m_bits & 0x1800;
  extraFlags_00.m_bits = uVar12 + 0x800;
  if (uVar18 != 0x1800) {
    extraFlags_00.m_bits = uVar12;
  }
  pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&local_190->left);
  uVar12 = 0;
  if (bVar15 != 0) {
    uVar12 = (ulong)(((byte)~bVar1 & 1) * 2);
  }
  extraFlags.m_bits = uVar12 + 0x800;
  if ((int)uVar18 != 0x1800) {
    extraFlags.m_bits = uVar12;
  }
  this_00 = Expression::create(local_198,pEVar7,&local_158,extraFlags,local_168);
  pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&local_190->right);
  compilation = local_198;
  this_01 = Expression::create(local_198,pEVar7,local_178,extraFlags_00,local_168);
  bVar2 = Expression::bad(this_00);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = Expression::bad(this_01);
  }
  local_1b0 = not_null<const_slang::ast::Type_*>::get(&this_00->type);
  local_1a0 = not_null<const_slang::ast::Type_*>::get(&this_01->type);
  bVar2 = Type::isUnbounded(local_1b0);
  if (bVar2) {
    local_1b0 = compilation->intType;
  }
  bVar2 = Type::isUnbounded(local_1a0);
  if (bVar2) {
    local_1a0 = compilation->intType;
  }
  pTVar8 = Expression::binaryOperatorType
                     (compilation,local_1b0,local_1a0,(bool)((byte)local_170 & 1),false);
  local_118._0_4_ =
       SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                 (&local_68,(EVP_PKEY_CTX *)compilation,src);
  local_118._4_4_ = extraout_var_00;
  local_188 = (iterator_base<slang::syntax::ConditionalPatternSyntax_*>)
              slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_190);
  expr = BumpAllocator::
         emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&local_198->super_BumpAllocator,pTVar8,
                    (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
                    local_118,this_00,this_01,(SourceRange *)&local_188);
  if (bVar17 != false || bVar3 != false) {
    expr = (ConditionalExpression *)Expression::badExpr(local_198,&expr->super_Expression);
    goto LAB_0031fad9;
  }
  bVar17 = Type::isNumeric(local_1b0);
  if ((!bVar17) || (bVar17 = Type::isNumeric(local_1a0), !bVar17)) {
    bVar17 = Type::isNull(local_1b0);
    if ((bVar17) && (bVar17 = Type::isNull(local_1a0), bVar17)) {
      SVar13 = (SourceLocation)Compilation::getNullType(local_198);
      local_188.list = (ParentList *)SVar13;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)local_118,(Type **)&local_188);
      SVar13 = (SourceLocation)local_118._0_8_;
    }
    else {
      bVar17 = Type::isClass(local_1b0);
      if (((((((bVar17) || (bVar17 = Type::isClass(local_1a0), bVar17)) ||
             (bVar17 = Type::isCHandle(local_1b0), bVar17)) ||
            ((bVar17 = Type::isCHandle(local_1a0), bVar17 ||
             (bVar17 = Type::isEvent(local_1b0), bVar17)))) ||
           ((bVar17 = Type::isEvent(local_1a0), bVar17 ||
            ((bVar17 = Type::isVirtualInterface(local_1b0), bVar17 ||
             (bVar17 = Type::isVirtualInterface(local_1a0), bVar17)))))) ||
          (bVar17 = Type::isCovergroup(local_1b0), bVar17)) ||
         (bVar17 = Type::isCovergroup(local_1a0), bVar17)) {
        bVar17 = Type::isNull(local_1b0);
        if (bVar17) {
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                    ((not_null<slang::ast::Type_const*> *)local_118,&local_1a0);
          SVar13 = (SourceLocation)local_118._0_8_;
        }
        else {
          bVar17 = Type::isNull(local_1a0);
          if (bVar17) {
            not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                      ((not_null<slang::ast::Type_const*> *)local_118,&local_1b0);
            SVar13 = (SourceLocation)local_118._0_8_;
          }
          else {
            bVar17 = Type::isAssignmentCompatible(local_1a0,local_1b0);
            if (bVar17) {
              not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                        ((not_null<slang::ast::Type_const*> *)local_118,&local_1a0);
              SVar13 = (SourceLocation)local_118._0_8_;
            }
            else {
              bVar17 = Type::isAssignmentCompatible(local_1b0,local_1a0);
              if (bVar17) {
                not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                          ((not_null<slang::ast::Type_const*> *)local_118,&local_1b0);
                SVar13 = (SourceLocation)local_118._0_8_;
              }
              else {
                local_118._0_8_ = Type::getCommonBase(local_1b0,local_1a0);
                if ((SourceLocation)local_118._0_8_ == (SourceLocation)0x0) {
                  bVar17 = Type::isEquivalent(local_1b0,local_1a0);
                  if (!bVar17) goto LAB_0031fbba;
                  not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                            ((not_null<slang::ast::Type_const*> *)&local_188,&local_1b0);
                }
                else {
                  not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                            ((not_null<slang::ast::Type_const*> *)&local_188,(Type **)local_118);
                }
                SVar13 = (SourceLocation)local_188.list;
              }
            }
          }
        }
      }
      else {
        bVar17 = Type::isEquivalent(local_1b0,local_1a0);
        if ((!bVar17) || (bVar17 = Type::isUnpackedUnion(local_1b0), bVar17)) {
          bVar17 = Expression::isImplicitString(this_00);
          if ((!bVar17) || (bVar17 = Expression::isImplicitString(this_01), !bVar17)) {
LAB_0031fbba:
            SVar13 = parsing::Token::location(&local_190->question);
            diag = ASTContext::addDiag(local_178,(DiagCode)0x200007,SVar13);
            diag_00 = ast::operator<<(diag,local_1b0);
            ast::operator<<(diag_00,local_1a0);
            Diagnostic::operator<<(diag,this_00->sourceRange);
            Diagnostic::operator<<(diag,this_01->sourceRange);
            expr = (ConditionalExpression *)Expression::badExpr(local_198,&expr->super_Expression);
            goto LAB_0031fad9;
          }
          local_188.list = (ParentList *)local_198->stringType;
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                    ((not_null<slang::ast::Type_const*> *)local_118,(Type **)&local_188);
          SVar13 = (SourceLocation)local_118._0_8_;
        }
        else {
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                    ((not_null<slang::ast::Type_const*> *)local_118,&local_1b0);
          SVar13 = (SourceLocation)local_118._0_8_;
        }
      }
    }
    (expr->super_Expression).type.ptr = (Type *)SVar13;
  }
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&local_190->attributes)
  ;
  ASTContext::setAttributes(local_178,&expr->super_Expression,syntax_00);
LAB_0031fad9:
  SmallVectorBase<slang::ast::ConditionalExpression::Condition>::~SmallVectorBase(&local_68);
  return &expr->super_Expression;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            Pattern::VarMap patternVarMap;
            pattern = &Pattern::bind(*condSyntax->matchesClause->pattern, *cond.type, patternVarMap,
                                     trueContext);

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
            bad |= pattern->bad();
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = binaryOperatorType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp), left,
                                                      right, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}